

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Flow * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::visitSIMDLoadZero
          (Flow *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,SIMDLoad *curr)

{
  Name memory;
  undefined1 this_00 [8];
  char *curr_00;
  bool bVar1;
  Index bytes;
  uint32_t init;
  int iVar2;
  ExpressionRunner<wasm::ModuleRunner> *this_01;
  Address memorySize_00;
  Literal *pLVar3;
  undefined4 extraout_var;
  array<wasm::Literal,_2UL> local_240;
  Literal local_210;
  undefined4 local_1f8;
  undefined4 uStack_1f4;
  undefined4 uStack_1f0;
  undefined4 uStack_1ec;
  address64_t local_1e8;
  undefined1 local_1e0 [8];
  Literal val_1;
  array<wasm::Literal,_4UL> local_1c0;
  Literal local_160;
  undefined4 local_148;
  undefined4 uStack_144;
  undefined4 uStack_140;
  undefined4 uStack_13c;
  address64_t local_130;
  undefined1 local_128 [8];
  Literal val;
  undefined1 local_108 [8];
  Literal zero;
  Literal local_e8;
  address64_t local_d0;
  Address src;
  Address memorySize;
  undefined1 local_90 [8];
  MemoryInstanceInfo info;
  undefined1 local_68 [8];
  Flow flow;
  SIMDLoad *curr_local;
  ModuleRunnerBase<wasm::ModuleRunner> *this_local;
  
  flow.breakTo.super_IString.str._M_str = (char *)curr;
  this_01 = (ExpressionRunner<wasm::ModuleRunner> *)self(this);
  ExpressionRunner<wasm::ModuleRunner>::visit
            ((Flow *)local_68,this_01,*(Expression **)(flow.breakTo.super_IString.str._M_str + 0x28)
            );
  bVar1 = Flow::breaking((Flow *)local_68);
  if (bVar1) {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_68);
    info.name.super_IString.str._M_str._0_4_ = 1;
  }
  else {
    getMemoryInstanceInfo
              ((MemoryInstanceInfo *)local_90,this,
               (Name)((IString *)(flow.breakTo.super_IString.str._M_str + 0x30))->str);
    memory.super_IString.str._M_len._4_4_ = info.instance._4_4_;
    memory.super_IString.str._M_len._0_4_ = info.instance._0_4_;
    memory.super_IString.str._M_str._4_4_ = info.name.super_IString.str._M_len._4_4_;
    memory.super_IString.str._M_str._0_4_ = (undefined4)info.name.super_IString.str._M_len;
    memorySize_00 = getMemorySize((ModuleRunnerBase<wasm::ModuleRunner> *)local_90,memory);
    curr_00 = flow.breakTo.super_IString.str._M_str;
    this_00 = local_90;
    pLVar3 = Flow::getSingleValue((Flow *)local_68);
    ::wasm::Literal::Literal(&local_e8,pLVar3);
    bytes = ::wasm::SIMDLoad::getMemBytes();
    zero.type.id = (uintptr_t)memorySize_00;
    local_d0 = (address64_t)
               getFinalAddress<wasm::SIMDLoad>
                         ((ModuleRunnerBase<wasm::ModuleRunner> *)this_00,(SIMDLoad *)curr_00,
                          &local_e8,bytes,memorySize_00);
    ::wasm::Literal::~Literal(&local_e8);
    Type::Type(&val.type,*(int *)(flow.breakTo.super_IString.str._M_str + 0x10) == 10 ^ i64);
    ::wasm::Literal::makeZero((Type)local_108);
    if (*(int *)(flow.breakTo.super_IString.str._M_str + 0x10) == 10) {
      local_130 = local_d0;
      local_148 = info.instance._0_4_;
      uStack_144 = info.instance._4_4_;
      uStack_140 = (undefined4)info.name.super_IString.str._M_len;
      uStack_13c = info.name.super_IString.str._M_len._4_4_;
      init = (*(*(ExternalInterface **)((long)local_90 + 0x288))->_vptr_ExternalInterface[0x12])
                       (*(ExternalInterface **)((long)local_90 + 0x288),local_d0,
                        CONCAT44(info.instance._4_4_,info.instance._0_4_),
                        CONCAT44(info.name.super_IString.str._M_len._4_4_,
                                 (undefined4)info.name.super_IString.str._M_len));
      wasm::Literal::Literal((Literal *)local_128,init);
      val_1.type.id = (uintptr_t)&local_1c0;
      ::wasm::Literal::Literal((Literal *)val_1.type.id,(Literal *)local_128);
      val_1.type.id = (uintptr_t)(local_1c0._M_elems + 1);
      ::wasm::Literal::Literal((Literal *)val_1.type.id,(Literal *)local_108);
      val_1.type.id = (uintptr_t)(local_1c0._M_elems + 2);
      ::wasm::Literal::Literal((Literal *)val_1.type.id,(Literal *)local_108);
      val_1.type.id = (uintptr_t)(local_1c0._M_elems + 3);
      ::wasm::Literal::Literal((Literal *)val_1.type.id,(Literal *)local_108);
      ::wasm::Literal::Literal(&local_160,(array *)&local_1c0);
      Flow::Flow(__return_storage_ptr__,&local_160);
      ::wasm::Literal::~Literal(&local_160);
      std::array<wasm::Literal,_4UL>::~array(&local_1c0);
      info.name.super_IString.str._M_str._0_4_ = 1;
      ::wasm::Literal::~Literal((Literal *)local_128);
    }
    else {
      local_1e8 = local_d0;
      local_1f8 = info.instance._0_4_;
      uStack_1f4 = info.instance._4_4_;
      uStack_1f0 = (undefined4)info.name.super_IString.str._M_len;
      uStack_1ec = info.name.super_IString.str._M_len._4_4_;
      iVar2 = (*(*(ExternalInterface **)((long)local_90 + 0x288))->_vptr_ExternalInterface[0x14])
                        (*(ExternalInterface **)((long)local_90 + 0x288),local_d0,
                         CONCAT44(info.instance._4_4_,info.instance._0_4_),
                         CONCAT44(info.name.super_IString.str._M_len._4_4_,
                                  (undefined4)info.name.super_IString.str._M_len));
      wasm::Literal::Literal((Literal *)local_1e0,CONCAT44(extraout_var,iVar2));
      ::wasm::Literal::Literal(local_240._M_elems,(Literal *)local_1e0);
      ::wasm::Literal::Literal(local_240._M_elems + 1,(Literal *)local_108);
      ::wasm::Literal::Literal(&local_210,(array *)&local_240);
      Flow::Flow(__return_storage_ptr__,&local_210);
      ::wasm::Literal::~Literal(&local_210);
      std::array<wasm::Literal,_2UL>::~array(&local_240);
      info.name.super_IString.str._M_str._0_4_ = 1;
      ::wasm::Literal::~Literal((Literal *)local_1e0);
    }
    ::wasm::Literal::~Literal((Literal *)local_108);
  }
  Flow::~Flow((Flow *)local_68);
  return __return_storage_ptr__;
}

Assistant:

Flow visitSIMDLoadZero(SIMDLoad* curr) {
    Flow flow = self()->visit(curr->ptr);
    if (flow.breaking()) {
      return flow;
    }
    NOTE_EVAL1(flow);
    auto info = getMemoryInstanceInfo(curr->memory);
    auto memorySize = info.instance->getMemorySize(info.name);
    Address src = info.instance->getFinalAddress(
      curr, flow.getSingleValue(), curr->getMemBytes(), memorySize);
    auto zero =
      Literal::makeZero(curr->op == Load32ZeroVec128 ? Type::i32 : Type::i64);
    if (curr->op == Load32ZeroVec128) {
      auto val =
        Literal(info.instance->externalInterface->load32u(src, info.name));
      return Literal(std::array<Literal, 4>{{val, zero, zero, zero}});
    } else {
      auto val =
        Literal(info.instance->externalInterface->load64u(src, info.name));
      return Literal(std::array<Literal, 2>{{val, zero}});
    }
  }